

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool cmSetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Rb_tree_node_base *key;
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  bool bVar3;
  pointer ppcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool source_file_target_option_enabled;
  cmTarget *this;
  const_iterator cVar9;
  cmTest *this_00;
  cmSourceFile *this_01;
  cmake *pcVar10;
  cmInstalledFile *this_02;
  _Base_ptr p_Var11;
  ostream *poVar12;
  string *psVar13;
  cmGlobalGenerator *this_03;
  cmMakefile *pcVar14;
  cmValue cVar15;
  cmState *this_04;
  pointer ppcVar16;
  char *extraout_RDX;
  bool asString;
  undefined4 uVar17;
  ostringstream *this_05;
  const_iterator __position;
  int iVar18;
  PropertyOp op;
  PropertyOp op_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  pointer pbVar20;
  string_view value;
  string_view value_00;
  string local_318;
  string propertyValue;
  string propertyName;
  undefined1 local_2a8 [56];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_absolute;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_files;
  ostringstream e;
  
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",(allocator<char> *)local_2a8
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_05 = &e;
LAB_00263a43:
    std::__cxx11::string::~string((string *)this_05);
    return false;
  }
  bVar5 = std::operator==(pbVar19,"GLOBAL");
  if (bVar5) {
    bVar5 = false;
    uVar17 = 3;
  }
  else {
    bVar5 = std::operator==(pbVar19,"DIRECTORY");
    uVar17 = 0;
    if (bVar5) {
      uVar17 = 2;
LAB_00263a8a:
      bVar5 = false;
    }
    else {
      bVar5 = std::operator==(pbVar19,"TARGET");
      if (bVar5) {
LAB_00263aa0:
        bVar5 = false;
      }
      else {
        bVar6 = std::operator==(pbVar19,"SOURCE");
        bVar5 = true;
        uVar17 = 1;
        if (!bVar6) {
          bVar5 = std::operator==(pbVar19,"TEST");
          if (bVar5) {
            uVar17 = 5;
          }
          else {
            bVar5 = std::operator==(pbVar19,"CACHE");
            if (!bVar5) {
              bVar5 = std::operator==(pbVar19,"INSTALL");
              if (!bVar5) {
                _e = (element_type *)0x14;
                local_2a8._8_8_ = (pbVar19->_M_dataplus)._M_p;
                local_2a8._0_8_ = pbVar19->_M_string_length;
                cmStrCat<char[77]>((string *)&names,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                                   (char (*) [77])
                                   ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                                  );
                std::__cxx11::string::_M_assign((string *)&status->Error);
                this_05 = (ostringstream *)&names;
                goto LAB_00263a43;
              }
              uVar17 = 8;
              goto LAB_00263aa0;
            }
            uVar17 = 4;
          }
          goto LAB_00263a8a;
        }
      }
    }
  }
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &names._M_t._M_impl.super__Rb_tree_header._M_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  propertyName.field_2._M_local_buf[0] = '\0';
  propertyValue._M_dataplus._M_p = (pointer)&propertyValue.field_2;
  propertyValue._M_string_length = 0;
  bVar8 = false;
  propertyValue.field_2._M_local_buf[0] = '\0';
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  bVar6 = false;
  source_file_target_option_enabled = false;
  iVar18 = 1;
  asString = false;
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00263b7d:
  pbVar19 = pbVar20 + 1;
  if (pbVar19 != pbVar2) {
    bVar7 = std::operator==(pbVar19,"PROPERTY");
    if (bVar7) {
      iVar18 = 2;
      pbVar20 = pbVar19;
    }
    else {
      bVar7 = std::operator==(pbVar19,"APPEND");
      if (!bVar7) {
        bVar7 = std::operator==(pbVar19,"APPEND_STRING");
        if (bVar7) {
          bVar3 = false;
          bVar8 = true;
          iVar18 = 0;
          asString = true;
          pbVar20 = pbVar19;
          goto LAB_00263b7d;
        }
        if (iVar18 - 4U < 0xfffffffe && bVar5) {
          bVar7 = std::operator==(pbVar19,"DIRECTORY");
          if (bVar7) {
            bVar6 = true;
            iVar18 = 4;
            pbVar20 = pbVar19;
            goto LAB_00263b7d;
          }
          bVar7 = std::operator==(pbVar19,"TARGET_DIRECTORY");
          if (bVar7) {
            source_file_target_option_enabled = true;
            iVar18 = 5;
            pbVar20 = pbVar19;
            goto LAB_00263b7d;
          }
        }
        switch(iVar18) {
        case 1:
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&names,pbVar19);
          iVar18 = 1;
          pbVar20 = pbVar19;
          break;
        case 2:
          std::__cxx11::string::_M_assign((string *)&propertyName);
          iVar18 = 3;
          pbVar20 = pbVar19;
          break;
        case 3:
          std::__cxx11::string::append((char *)&propertyValue);
          std::__cxx11::string::append((string *)&propertyValue);
          bVar3 = false;
          iVar18 = 3;
          pbVar20 = pbVar19;
          break;
        case 4:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&source_file_directories,pbVar19);
          iVar18 = 4;
          pbVar20 = pbVar19;
          break;
        case 5:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&source_file_target_directories,pbVar19);
          iVar18 = 5;
          pbVar20 = pbVar19;
          break;
        default:
          _e = &DAT_00000018;
          local_2a8._8_8_ = (pbVar19->_M_dataplus)._M_p;
          local_2a8._0_8_ = pbVar20[1]._M_string_length;
          cmStrCat<char[3]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                            (char (*) [3])0x67b310);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          psVar13 = &local_318;
          goto LAB_00263ef7;
        }
        goto LAB_00263b7d;
      }
      bVar3 = false;
      bVar8 = true;
      iVar18 = 0;
      asString = false;
      pbVar20 = pbVar19;
    }
    goto LAB_00263b7d;
  }
  if (propertyName._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"not given a PROPERTY <name> argument.",(allocator<char> *)local_2a8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar13 = (string *)&e;
LAB_00263ef7:
    std::__cxx11::string::~string((string *)psVar13);
    bVar5 = false;
    goto LAB_00264a09;
  }
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (status,bVar6,source_file_target_option_enabled,&source_file_directories,
                     &source_file_target_directories,&source_file_directory_makefiles);
  p_Var11 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (!bVar5) {
LAB_002649fa:
    bVar5 = false;
    goto switchD_00263d8e_caseD_6;
  }
  bVar5 = true;
  switch(uVar17) {
  case 0:
    for (; (_Rb_tree_header *)p_Var11 != &names._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      bVar5 = cmMakefile::IsAlias(status->Makefile,(string *)(p_Var11 + 1));
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"can not be used on an ALIAS target.",(allocator<char> *)local_2a8);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002649ed;
      }
      this = cmMakefile::FindTargetToUse(status->Makefile,(string *)(p_Var11 + 1),false);
      if (this == (cmTarget *)0x0) {
        _e = (element_type *)0x16;
        local_2a8._8_8_ = *(undefined8 *)(p_Var11 + 1);
        local_2a8._0_8_ = p_Var11[1]._M_parent;
        cmStrCat<char[40]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                           (char (*) [40])".  Perhaps it has not yet been created.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0026490a;
      }
      pcVar14 = status->Makefile;
      if (bVar8) {
        cmMakefile::GetBacktrace((cmMakefile *)local_2a8);
        _e = local_2a8._0_8_;
        local_2a8._0_8_ = (element_type *)0x0;
        local_2a8._8_8_ = (pointer)0x0;
        cmTarget::AppendProperty
                  (this,&propertyName,&propertyValue,(optional<cmListFileBacktrace> *)&e,asString);
        std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
                  ((_Optional_payload_base<cmListFileBacktrace> *)&e);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a8 + 8));
      }
      else if (bVar3) {
        cmTarget::SetProperty(this,&propertyName,(char *)0x0);
      }
      else {
        cmTarget::SetProperty(this,&propertyName,&propertyValue);
      }
      cmTarget::CheckProperty(this,&propertyName,pcVar14);
    }
    goto LAB_002648ad;
  case 1:
    files_absolute.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files_absolute.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files_absolute.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unique_files,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )names._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&names._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&e);
    SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded
              (status,&files_absolute,
               (const_iterator)
               unique_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (const_iterator)
               unique_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (bool)(bVar6 | source_file_target_option_enabled));
    ppcVar4 = source_file_directory_makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    op_00 = AppendAsString;
    if (asString == false) {
      op_00 = bVar8 + Set;
    }
    if (bVar3) {
      op_00 = Remove;
    }
    for (ppcVar16 = source_file_directory_makefiles.
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pbVar2 = files_absolute.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, bVar5 = ppcVar16 == ppcVar4, !bVar5;
        ppcVar16 = ppcVar16 + 1) {
      pcVar14 = *ppcVar16;
      for (pbVar20 = files_absolute.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar2;
          pbVar20 = pbVar20 + 1) {
        this_01 = cmMakefile::GetOrCreateSource(pcVar14,pbVar20,false,Ambiguous);
        if (this_01 == (cmSourceFile *)0x0) {
          _e = (element_type *)0x36;
          local_2a8._8_8_ = (pbVar20->_M_dataplus)._M_p;
          local_2a8._0_8_ = pbVar20->_M_string_length;
          cmStrCat<>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_318);
          goto LAB_00264418;
        }
        bVar6 = std::operator==(&propertyName,"GENERATED");
        if (bVar6) {
          SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
                    (this_01,&propertyValue,op_00);
        }
        else if (bVar8 == false) {
          if (bVar3) {
            cmSourceFile::SetProperty(this_01,&propertyName,(char *)0x0);
          }
          else {
            cmSourceFile::SetProperty(this_01,&propertyName,&propertyValue);
          }
        }
        else {
          cmSourceFile::AppendProperty(this_01,&propertyName,&propertyValue,asString);
        }
      }
    }
LAB_00264418:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unique_files);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files_absolute);
    break;
  case 2:
    if (1 < names._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"allows at most one name for DIRECTORY scope.",
                 (allocator<char> *)local_2a8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002649ed:
      psVar13 = (string *)&e;
      goto LAB_002649f5;
    }
    pcVar14 = status->Makefile;
    if (names._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar14);
      cmsys::SystemTools::CollapseFullPath((string *)&e,(string *)(p_Var11 + 1),psVar13);
      this_03 = cmMakefile::GetGlobalGenerator(status->Makefile);
      pcVar14 = cmGlobalGenerator::FindMakefile(this_03,(string *)&e);
      if (pcVar14 == (cmMakefile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,(allocator<char> *)&local_318);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)local_2a8);
        goto LAB_002649ed;
      }
      std::__cxx11::string::~string((string *)&e);
    }
    if (bVar8 == false) {
      if (bVar3) {
        cmMakefile::SetProperty(pcVar14,&propertyName,(char *)0x0);
      }
      else {
        cmMakefile::SetProperty(pcVar14,&propertyName,&propertyValue);
      }
    }
    else {
      cmMakefile::AppendProperty(pcVar14,&propertyName,&propertyValue,asString);
    }
    break;
  case 3:
    if (names._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"given names for GLOBAL scope.",(allocator<char> *)local_2a8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_002649ed;
    }
    pcVar10 = cmMakefile::GetCMakeInstance(status->Makefile);
    if (bVar8 == false) {
      if (bVar3) {
        cmake::SetProperty(pcVar10,&propertyName,(char *)0x0);
      }
      else {
        cmake::SetProperty(pcVar10,&propertyName,&propertyValue);
      }
    }
    else {
      cmake::AppendProperty(pcVar10,&propertyName,&propertyValue,asString);
    }
    break;
  case 4:
    bVar5 = std::operator==(&propertyName,"ADVANCED");
    if (bVar5) {
      if (((bVar3) ||
          (value._M_str = extraout_RDX, value._M_len = (size_t)propertyValue._M_dataplus._M_p,
          bVar5 = cmValue::IsOn((cmValue *)propertyValue._M_string_length,value), bVar5)) ||
         (value_00._M_str = propertyValue._M_dataplus._M_p,
         value_00._M_len = propertyValue._M_string_length, bVar5 = cmValue::IsOff(value_00), bVar5))
      goto LAB_00264803;
      _e = (element_type *)0x19;
      local_2a8._0_8_ = propertyValue._M_string_length;
      local_2a8._8_8_ = propertyValue._M_dataplus._M_p;
      cmStrCat<char[35]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                         (char (*) [35])"\" for CACHE property \"ADVANCED\".  ");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      bVar5 = std::operator==(&propertyName,"TYPE");
      if (bVar5) {
        bVar5 = cmState::IsCacheEntryType(&propertyValue);
        if (bVar5) {
LAB_00264803:
          for (p_Var11 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var11 != &names._M_t._M_impl.super__Rb_tree_header;
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
            pcVar10 = cmMakefile::GetCMakeInstance(status->Makefile);
            key = p_Var11 + 1;
            cVar15 = cmState::GetCacheEntryValue
                               ((pcVar10->State)._M_t.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)key);
            if (cVar15.Value == (string *)0x0) {
              _e = &DAT_0000001e;
              local_2a8._8_8_ = *(undefined8 *)(p_Var11 + 1);
              local_2a8._0_8_ = p_Var11[1]._M_parent;
              cmStrCat<char[40]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                                 (char (*) [40])".  Perhaps it has not yet been created.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0026490a;
            }
            this_04 = cmMakefile::GetState(status->Makefile);
            if (bVar3) {
              cmState::RemoveCacheEntryProperty(this_04,(string *)key,&propertyName);
            }
            if (bVar8 == false) {
              cmState::SetCacheEntryProperty(this_04,(string *)key,&propertyName,&propertyValue);
            }
            else {
              cmState::AppendCacheEntryProperty
                        (this_04,(string *)key,&propertyName,&propertyValue,asString);
            }
          }
          goto LAB_002648ad;
        }
        _e = (element_type *)0x20;
        local_2a8._0_8_ = propertyValue._M_string_length;
        local_2a8._8_8_ = propertyValue._M_dataplus._M_p;
        cmStrCat<char[2]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,(char (*) [2])0x6735bd
                         );
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        bVar5 = std::operator!=(&propertyName,"HELPSTRING");
        if (((!bVar5) || (bVar5 = std::operator!=(&propertyName,"STRINGS"), !bVar5)) ||
           (bVar5 = std::operator!=(&propertyName,"VALUE"), !bVar5)) goto LAB_00264803;
        _e = (element_type *)0x1d;
        local_2a8._0_8_ = propertyName._M_string_length;
        local_2a8._8_8_ = propertyName._M_dataplus._M_p;
        cmStrCat<char[82]>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8,
                           (char (*) [82])
                           ".  Settable CACHE properties are: ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."
                          );
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
LAB_0026490a:
    psVar13 = &local_318;
LAB_002649f5:
    std::__cxx11::string::~string((string *)psVar13);
    goto LAB_002649fa;
  case 5:
    p_Var1 = &names._M_t._M_impl.super__Rb_tree_header;
    cVar9._M_node = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (__position._M_node = cVar9._M_node, (_Rb_tree_header *)__position._M_node != p_Var1) {
      cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      this_00 = cmMakefile::GetTest(status->Makefile,(string *)(__position._M_node + 1));
      if (this_00 != (cmTest *)0x0) {
        if (bVar8 == false) {
          if (bVar3) {
            cmTest::SetProperty(this_00,&propertyName,(char *)0x0);
          }
          else {
            cmTest::SetProperty(this_00,&propertyName,&propertyValue);
          }
        }
        else {
          cmTest::AppendProperty(this_00,&propertyName,&propertyValue,asString);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&names,__position);
      }
    }
    bVar5 = true;
    if (names._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"given TEST names that do not exist:\n");
      for (p_Var11 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != p_Var1;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        poVar12 = std::operator<<((ostream *)&e,"  ");
        poVar12 = std::operator<<(poVar12,(string *)(p_Var11 + 1));
        std::operator<<(poVar12,"\n");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_002649fa;
    }
    break;
  case 8:
    pcVar10 = cmMakefile::GetCMakeInstance(status->Makefile);
    for (p_Var11 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &names._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      this_02 = cmake::GetOrCreateInstalledFile(pcVar10,status->Makefile,(string *)(p_Var11 + 1));
      if (this_02 == (cmInstalledFile *)0x0) {
        _e = (element_type *)0x37;
        local_2a8._8_8_ = *(undefined8 *)(p_Var11 + 1);
        local_2a8._0_8_ = p_Var11[1]._M_parent;
        cmStrCat<>(&local_318,(cmAlphaNum *)&e,(cmAlphaNum *)local_2a8);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0026490a;
      }
      if (bVar3) {
        cmInstalledFile::RemoveProperty(this_02,&propertyName);
      }
      else if (bVar8 == false) {
        cmInstalledFile::SetProperty(this_02,status->Makefile,&propertyName,&propertyValue);
      }
      else {
        cmInstalledFile::AppendProperty
                  (this_02,status->Makefile,&propertyName,&propertyValue,asString);
      }
    }
LAB_002648ad:
    bVar5 = true;
  }
switchD_00263d8e_caseD_6:
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&source_file_directory_makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_00264a09:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_target_directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_directories);
  std::__cxx11::string::~string((string *)&propertyValue);
  std::__cxx11::string::~string((string *)&propertyName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&names._M_t);
  return bVar5;
}

Assistant:

bool cmSetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat("given invalid scope ", scopeName,
                             ".  "
                             "Valid scopes are GLOBAL, DIRECTORY, "
                             "TARGET, SOURCE, TEST, CACHE, INSTALL."));
    return false;
  }

  bool appendAsString = false;
  bool appendMode = false;
  bool remove = true;
  std::set<std::string> names;
  std::string propertyName;
  std::string propertyValue;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNames) {
      names.insert(arg);
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(arg);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(arg);
    } else if (doing == DoingProperty) {
      propertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      propertyValue += sep;
      sep = ";";
      propertyValue += arg;
      remove = false;
    } else {
      status.SetError(cmStrCat("given invalid argument \"", arg, "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return HandleGlobalMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::DIRECTORY:
      return HandleDirectoryMode(status, names, propertyName, propertyValue,
                                 appendAsString, appendMode, remove);
    case cmProperty::TARGET:
      return HandleTargetMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::SOURCE_FILE:
      return HandleSourceMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove,
                              source_file_directory_makefiles,
                              source_file_paths_should_be_absolute);
    case cmProperty::TEST:
      return HandleTestMode(status, names, propertyName, propertyValue,
                            appendAsString, appendMode, remove);
    case cmProperty::CACHE:
      return HandleCacheMode(status, names, propertyName, propertyValue,
                             appendAsString, appendMode, remove);
    case cmProperty::INSTALL:
      return HandleInstallMode(status, names, propertyName, propertyValue,
                               appendAsString, appendMode, remove);

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}